

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
          (cmLocalUnixMakefileGenerator3 *this,ostream *cmakefileStream,cmGeneratorTarget *target)

{
  cmOutputConverter *this_00;
  cmMakefile *pcVar1;
  _Base_ptr p_Var2;
  pointer pbVar3;
  bool bVar4;
  ostream *poVar5;
  string *psVar6;
  ImplicitDependLanguageMap *pIVar7;
  _Rb_tree_header *p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  cmValue cVar11;
  cmState *pcVar12;
  string *psVar13;
  _Rb_tree_node_base *p_Var14;
  char *extraout_RDX;
  ImplicitDependLanguageMap *__range1;
  string *path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *di;
  _Base_ptr p_Var15;
  long lVar16;
  char *pcVar17;
  cmAlphaNum *in_R8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *defines_00;
  string *tr;
  const_iterator __first;
  pointer pbVar18;
  long lVar19;
  string_view value;
  string_view str;
  string_view str_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view arg;
  string_view arg_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transformRules;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string depFormat;
  string cidVar;
  
  poVar5 = std::operator<<(cmakefileStream,"\n");
  poVar5 = std::operator<<(poVar5,"# Consider dependencies only in project.\n");
  poVar5 = std::operator<<(poVar5,"set(CMAKE_DEPENDS_IN_PROJECT_ONLY ");
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defines,"CMAKE_DEPENDS_IN_PROJECT_ONLY",(allocator<char> *)&transformRules);
  psVar6 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&defines);
  value._M_str = extraout_RDX;
  value._M_len = (size_t)(psVar6->_M_dataplus)._M_p;
  bVar4 = cmValue::IsOn((cmValue *)psVar6->_M_string_length,value);
  pcVar17 = "OFF";
  if (bVar4) {
    pcVar17 = "ON";
  }
  poVar5 = std::operator<<(poVar5,pcVar17);
  std::operator<<(poVar5,")\n\n");
  std::__cxx11::string::~string((string *)&defines);
  pIVar7 = GetImplicitDepends_abi_cxx11_(this,target,CMake);
  std::operator<<(cmakefileStream,
                  "# The set of languages for which implicit dependencies are needed:\n");
  std::operator<<(cmakefileStream,"set(CMAKE_DEPENDS_LANGUAGES\n");
  p_Var8 = &(pIVar7->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var9 = (pIVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != p_Var8; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    poVar5 = std::operator<<(cmakefileStream,"  \"");
    poVar5 = std::operator<<(poVar5,(string *)(p_Var9 + 1));
    std::operator<<(poVar5,"\"\n");
  }
  std::operator<<(cmakefileStream,"  )\n");
  if ((pIVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::operator<<(cmakefileStream,
                    "# The set of files for implicit dependencies of each language:\n");
    for (p_Var9 = (pIVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != p_Var8; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      p_Var14 = p_Var9 + 1;
      poVar5 = std::operator<<(cmakefileStream,"set(CMAKE_DEPENDS_CHECK_");
      poVar5 = std::operator<<(poVar5,(string *)p_Var14);
      std::operator<<(poVar5,"\n");
      for (p_Var10 = p_Var9[2]._M_right; p_Var10 != (_Base_ptr)&p_Var9[2]._M_parent;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        p_Var2 = p_Var10[2]._M_parent;
        for (p_Var15 = *(_Base_ptr *)(p_Var10 + 2); p_Var15 != p_Var2; p_Var15 = p_Var15 + 1) {
          poVar5 = std::operator<<(cmakefileStream,"  \"");
          poVar5 = std::operator<<(poVar5,(string *)p_Var15);
          std::operator<<(poVar5,"\" ");
          poVar5 = std::operator<<(cmakefileStream,"\"");
          poVar5 = std::operator<<(poVar5,(string *)(p_Var10 + 1));
          std::operator<<(poVar5,"\"\n");
        }
      }
      std::operator<<(cmakefileStream,"  )\n");
      defines._M_t._M_impl._0_8_ = 6;
      defines._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (long)"The CMAKE_" + 4;
      transformRules.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(p_Var9 + 1);
      transformRules.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var9[1]._M_parent;
      cmStrCat<char[13]>(&cidVar,(cmAlphaNum *)&defines,(cmAlphaNum *)&transformRules,
                         (char (*) [13])0x6441fa);
      cVar11 = cmMakefile::GetDefinition
                         ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,
                          &cidVar);
      if ((cVar11.Value != (string *)0x0) && ((cVar11.Value)->_M_string_length != 0)) {
        poVar5 = std::operator<<(cmakefileStream,"set(CMAKE_");
        poVar5 = std::operator<<(poVar5,(string *)p_Var14);
        poVar5 = std::operator<<(poVar5,"_COMPILER_ID \"");
        poVar5 = std::operator<<(poVar5,(string *)cVar11.Value);
        std::operator<<(poVar5,"\")\n");
      }
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              p_Var14,"Fortran");
      if (bVar4) {
        pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&transformRules,"CMAKE_Fortran_SUBMODULE_SEP",
                   (allocator<char> *)&depFormat);
        psVar6 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&transformRules);
        std::__cxx11::string::string((string *)&defines,(string *)psVar6);
        std::__cxx11::string::~string((string *)&transformRules);
        pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&depFormat,"CMAKE_Fortran_SUBMODULE_EXT",(allocator<char> *)&includes);
        psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&depFormat);
        std::__cxx11::string::string((string *)&transformRules,(string *)psVar6);
        std::__cxx11::string::~string((string *)&depFormat);
        poVar5 = std::operator<<(cmakefileStream,"set(CMAKE_Fortran_SUBMODULE_SEP \"");
        poVar5 = std::operator<<(poVar5,(string *)&defines);
        std::operator<<(poVar5,"\")\n");
        poVar5 = std::operator<<(cmakefileStream,"set(CMAKE_Fortran_SUBMODULE_EXT \"");
        poVar5 = std::operator<<(poVar5,(string *)&transformRules);
        std::operator<<(poVar5,"\")\n");
        std::__cxx11::string::~string((string *)&transformRules);
        std::__cxx11::string::~string((string *)&defines);
      }
      defines._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           defines._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      defines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &defines._M_t._M_impl.super__Rb_tree_header._M_header;
      defines._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      defines._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      GetConfigName_abi_cxx11_((string *)&transformRules,this);
      defines_00 = &defines;
      cmLocalGenerator::GetTargetDefines
                ((cmLocalGenerator *)this,target,(string *)&transformRules,(string *)p_Var14,
                 defines_00);
      std::__cxx11::string::~string((string *)&transformRules);
      if (defines._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        poVar5 = std::operator<<(cmakefileStream,"\n");
        poVar5 = std::operator<<(poVar5,"# Preprocessor definitions for this target.\n");
        poVar5 = std::operator<<(poVar5,"set(CMAKE_TARGET_DEFINITIONS_");
        poVar5 = std::operator<<(poVar5,(string *)p_Var14);
        std::operator<<(poVar5,"\n");
        for (p_Var10 = defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var10 != &defines._M_t._M_impl.super__Rb_tree_header;
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
          poVar5 = std::operator<<(cmakefileStream,"  ");
          str._M_str = (char *)0x0;
          str._M_len = *(ulong *)(p_Var10 + 1);
          cmOutputConverter::EscapeForCMake_abi_cxx11_
                    ((string *)&transformRules,(cmOutputConverter *)p_Var10[1]._M_parent,str,
                     (WrapQuotes)defines_00);
          poVar5 = std::operator<<(poVar5,(string *)&transformRules);
          std::operator<<(poVar5,"\n");
          std::__cxx11::string::~string((string *)&transformRules);
        }
        std::operator<<(cmakefileStream,"  )\n");
      }
      poVar5 = std::operator<<(cmakefileStream,"\n");
      std::operator<<(poVar5,"# The include file search paths:\n");
      poVar5 = std::operator<<(cmakefileStream,"set(CMAKE_");
      poVar5 = std::operator<<(poVar5,(string *)p_Var14);
      std::operator<<(poVar5,"_TARGET_INCLUDE_PATH\n");
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GetConfigName_abi_cxx11_((string *)&transformRules,this);
      in_R8 = (cmAlphaNum *)&transformRules;
      cmLocalGenerator::GetIncludeDirectories
                ((cmLocalGenerator *)this,&includes,target,(string *)p_Var14,
                 (string *)&transformRules);
      std::__cxx11::string::~string((string *)&transformRules);
      pcVar12 = cmLocalGenerator::GetState((cmLocalGenerator *)this);
      psVar13 = cmState::GetBinaryDirectory_abi_cxx11_(pcVar12);
      pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&transformRules,"CMAKE_DEPENDS_IN_PROJECT_ONLY",
                 (allocator<char> *)&depFormat);
      bVar4 = cmMakefile::IsOn(pcVar1,(string *)&transformRules);
      std::__cxx11::string::~string((string *)&transformRules);
      path = includes.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      psVar6 = includes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar4) {
        pcVar12 = cmLocalGenerator::GetState((cmLocalGenerator *)this);
        psVar6 = cmState::GetSourceDirectory_abi_cxx11_(pcVar12);
        pbVar3 = includes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        transformRules.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar6->_M_dataplus)._M_p;
        transformRules.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar6->_M_string_length;
        depFormat.field_2._8_8_ = (psVar13->_M_dataplus)._M_p;
        transformRules.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)psVar13->_M_string_length;
        lVar19 = (long)includes.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)includes.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        pbVar18 = includes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        depFormat._M_dataplus._M_p =
             (pointer)transformRules.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        depFormat._M_string_length =
             (size_type)
             transformRules.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        depFormat.field_2._M_allocated_capacity =
             (size_type)
             transformRules.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        for (lVar16 = lVar19 >> 7; psVar6 = pbVar18, 0 < lVar16; lVar16 = lVar16 + -1) {
          bVar4 = anon_unknown.dwarf_17c0277::NotInProjectDir::operator()
                            ((NotInProjectDir *)&transformRules,pbVar18);
          if (bVar4) goto LAB_00418066;
          bVar4 = anon_unknown.dwarf_17c0277::NotInProjectDir::operator()
                            ((NotInProjectDir *)&transformRules,pbVar18 + 1);
          psVar6 = pbVar18 + 1;
          if (bVar4) goto LAB_00418066;
          bVar4 = anon_unknown.dwarf_17c0277::NotInProjectDir::operator()
                            ((NotInProjectDir *)&transformRules,pbVar18 + 2);
          psVar6 = pbVar18 + 2;
          if (bVar4) goto LAB_00418066;
          bVar4 = anon_unknown.dwarf_17c0277::NotInProjectDir::operator()
                            ((NotInProjectDir *)&transformRules,pbVar18 + 3);
          psVar6 = pbVar18 + 3;
          if (bVar4) goto LAB_00418066;
          pbVar18 = pbVar18 + 4;
          lVar19 = lVar19 + -0x80;
        }
        lVar19 = lVar19 >> 5;
        if (lVar19 == 1) {
LAB_00418189:
          bVar4 = anon_unknown.dwarf_17c0277::NotInProjectDir::operator()
                            ((NotInProjectDir *)&transformRules,pbVar18);
          psVar6 = pbVar18;
          if (!bVar4) {
            psVar6 = pbVar3;
          }
LAB_00418066:
          __first._M_current = psVar6;
          if (psVar6 != pbVar3) {
            while (psVar6 = psVar6 + 1, psVar6 != pbVar3) {
              bVar4 = anon_unknown.dwarf_17c0277::NotInProjectDir::operator()
                                ((NotInProjectDir *)&depFormat,psVar6);
              if (!bVar4) {
                std::__cxx11::string::operator=((string *)__first._M_current,(string *)psVar6);
                __first._M_current = __first._M_current + 1;
              }
            }
          }
        }
        else {
          if (lVar19 == 2) {
LAB_0041816d:
            bVar4 = anon_unknown.dwarf_17c0277::NotInProjectDir::operator()
                              ((NotInProjectDir *)&transformRules,pbVar18);
            psVar6 = pbVar18;
            if (!bVar4) {
              pbVar18 = pbVar18 + 1;
              goto LAB_00418189;
            }
            goto LAB_00418066;
          }
          __first._M_current = pbVar3;
          if (lVar19 == 3) {
            bVar4 = anon_unknown.dwarf_17c0277::NotInProjectDir::operator()
                              ((NotInProjectDir *)&transformRules,pbVar18);
            if (!bVar4) {
              pbVar18 = pbVar18 + 1;
              goto LAB_0041816d;
            }
            goto LAB_00418066;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(&includes,__first,
                (const_iterator)
                includes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
        path = includes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        psVar6 = includes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; path != psVar6; path = path + 1) {
        poVar5 = std::operator<<(cmakefileStream,"  \"");
        cmOutputConverter::MaybeRelativeToTopBinDir
                  ((string *)&transformRules,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,path);
        poVar5 = std::operator<<(poVar5,(string *)&transformRules);
        std::operator<<(poVar5,"\"\n");
        std::__cxx11::string::~string((string *)&transformRules);
      }
      std::operator<<(cmakefileStream,"  )\n");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&includes);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&defines._M_t);
      std::__cxx11::string::~string((string *)&cidVar);
    }
    transformRules.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    transformRules.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    transformRules.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defines,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",(allocator<char> *)&depFormat
              );
    cVar11 = cmMakefile::GetProperty(pcVar1,(string *)&defines);
    std::__cxx11::string::~string((string *)&defines);
    if (cVar11.Value != (string *)0x0) {
      arg._M_str = ((cVar11.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar11.Value)->_M_string_length;
      cmExpandList(arg,&transformRules,false);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defines,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",(allocator<char> *)&depFormat
              );
    cVar11 = cmGeneratorTarget::GetProperty(target,(string *)&defines);
    std::__cxx11::string::~string((string *)&defines);
    if (cVar11.Value != (string *)0x0) {
      arg_00._M_str = ((cVar11.Value)->_M_dataplus)._M_p;
      arg_00._M_len = (cVar11.Value)->_M_string_length;
      cmExpandList(arg_00,&transformRules,false);
    }
    if (transformRules.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        transformRules.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::operator<<(cmakefileStream,"\nset(CMAKE_INCLUDE_TRANSFORMS\n");
      pbVar3 = transformRules.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar18 = transformRules.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar3;
          pbVar18 = pbVar18 + 1) {
        poVar5 = std::operator<<(cmakefileStream,"  ");
        str_00._M_str = (char *)0x0;
        str_00._M_len = (size_t)(pbVar18->_M_dataplus)._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  ((string *)&defines,(cmOutputConverter *)pbVar18->_M_string_length,str_00,
                   (WrapQuotes)in_R8);
        poVar5 = std::operator<<(poVar5,(string *)&defines);
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string((string *)&defines);
      }
      std::operator<<(cmakefileStream,"  )\n");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&transformRules);
  }
  pIVar7 = GetImplicitDepends_abi_cxx11_(this,target,Compiler);
  std::operator<<(cmakefileStream,"\n# The set of dependency files which are needed:\n");
  std::operator<<(cmakefileStream,"set(CMAKE_DEPENDS_DEPENDENCY_FILES\n");
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  for (p_Var9 = (pIVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != &(pIVar7->_M_t)._M_impl.super__Rb_tree_header;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    __y._M_str = "CUSTOM";
    __y._M_len = 6;
    __x._M_str = *(char **)(p_Var9 + 1);
    __x._M_len = (size_t)p_Var9[1]._M_parent;
    bVar4 = std::operator==(__x,__y);
    if (bVar4) {
      for (p_Var14 = p_Var9[2]._M_right; p_Var14 != (_Rb_tree_node_base *)&p_Var9[2]._M_parent;
          p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
        p_Var15 = p_Var14[2]._M_parent;
        for (p_Var10 = *(_Base_ptr *)(p_Var14 + 2); p_Var10 != p_Var15; p_Var10 = p_Var10 + 1) {
          poVar5 = std::operator<<(cmakefileStream,"  \"\" \"");
          cmOutputConverter::MaybeRelativeToTopBinDir
                    ((string *)&defines,this_00,(string *)(p_Var14 + 1));
          poVar5 = std::operator<<(poVar5,(string *)&defines);
          poVar5 = std::operator<<(poVar5,"\" \"custom\" \"");
          cmOutputConverter::MaybeRelativeToTopBinDir
                    ((string *)&transformRules,this_00,(string *)p_Var10);
          poVar5 = std::operator<<(poVar5,(string *)&transformRules);
          std::operator<<(poVar5,"\"\n");
          std::__cxx11::string::~string((string *)&transformRules);
          std::__cxx11::string::~string((string *)&defines);
        }
      }
    }
    else {
      pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      defines._M_t._M_impl._0_8_ = 6;
      defines._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (long)"The CMAKE_" + 4;
      transformRules.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(p_Var9 + 1);
      transformRules.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var9[1]._M_parent;
      cmStrCat<char[16]>(&cidVar,(cmAlphaNum *)&defines,(cmAlphaNum *)&transformRules,
                         (char (*) [16])0x643467);
      psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&cidVar);
      std::__cxx11::string::string((string *)&depFormat,(string *)psVar6);
      std::__cxx11::string::~string((string *)&cidVar);
      for (p_Var14 = p_Var9[2]._M_right; p_Var14 != (_Rb_tree_node_base *)&p_Var9[2]._M_parent;
          p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
        p_Var15 = p_Var14[2]._M_parent;
        for (p_Var10 = *(_Base_ptr *)(p_Var14 + 2); p_Var10 != p_Var15; p_Var10 = p_Var10 + 1) {
          poVar5 = std::operator<<(cmakefileStream,"  \"");
          poVar5 = std::operator<<(poVar5,(string *)p_Var10);
          poVar5 = std::operator<<(poVar5,"\" \"");
          cmOutputConverter::MaybeRelativeToTopBinDir
                    ((string *)&defines,this_00,(string *)(p_Var14 + 1));
          poVar5 = std::operator<<(poVar5,(string *)&defines);
          poVar5 = std::operator<<(poVar5,"\" \"");
          poVar5 = std::operator<<(poVar5,(string *)&depFormat);
          poVar5 = std::operator<<(poVar5,"\" \"");
          cmOutputConverter::MaybeRelativeToTopBinDir
                    ((string *)&transformRules,this_00,(string *)(p_Var14 + 1));
          poVar5 = std::operator<<(poVar5,(string *)&transformRules);
          std::operator<<(poVar5,".d\"\n");
          std::__cxx11::string::~string((string *)&transformRules);
          std::__cxx11::string::~string((string *)&defines);
        }
      }
      std::__cxx11::string::~string((string *)&depFormat);
    }
  }
  std::operator<<(cmakefileStream,"  )\n");
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo(
  std::ostream& cmakefileStream, cmGeneratorTarget* target)
{
  // To enable dependencies filtering
  cmakefileStream << "\n"
                  << "# Consider dependencies only in project.\n"
                  << "set(CMAKE_DEPENDS_IN_PROJECT_ONLY "
                  << (cmIsOn(this->Makefile->GetSafeDefinition(
                        "CMAKE_DEPENDS_IN_PROJECT_ONLY"))
                        ? "ON"
                        : "OFF")
                  << ")\n\n";

  auto const& implicitLangs =
    this->GetImplicitDepends(target, cmDependencyScannerKind::CMake);

  // list the languages
  cmakefileStream << "# The set of languages for which implicit "
                     "dependencies are needed:\n";
  cmakefileStream << "set(CMAKE_DEPENDS_LANGUAGES\n";
  for (auto const& implicitLang : implicitLangs) {
    cmakefileStream << "  \"" << implicitLang.first << "\"\n";
  }
  cmakefileStream << "  )\n";

  if (!implicitLangs.empty()) {
    // now list the files for each language
    cmakefileStream
      << "# The set of files for implicit dependencies of each language:\n";
    for (auto const& implicitLang : implicitLangs) {
      const auto& lang = implicitLang.first;

      cmakefileStream << "set(CMAKE_DEPENDS_CHECK_" << lang << "\n";
      auto const& implicitPairs = implicitLang.second;

      // for each file pair
      for (auto const& implicitPair : implicitPairs) {
        for (auto const& di : implicitPair.second) {
          cmakefileStream << "  \"" << di << "\" ";
          cmakefileStream << "\"" << implicitPair.first << "\"\n";
        }
      }
      cmakefileStream << "  )\n";

      // Tell the dependency scanner what compiler is used.
      std::string cidVar = cmStrCat("CMAKE_", lang, "_COMPILER_ID");
      cmValue cid = this->Makefile->GetDefinition(cidVar);
      if (cmNonempty(cid)) {
        cmakefileStream << "set(CMAKE_" << lang << "_COMPILER_ID \"" << *cid
                        << "\")\n";
      }

      if (lang == "Fortran") {
        std::string smodSep =
          this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
        std::string smodExt =
          this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
        cmakefileStream << "set(CMAKE_Fortran_SUBMODULE_SEP \"" << smodSep
                        << "\")\n";
        cmakefileStream << "set(CMAKE_Fortran_SUBMODULE_EXT \"" << smodExt
                        << "\")\n";
      }

      // Build a list of preprocessor definitions for the target.
      std::set<std::string> defines;
      this->GetTargetDefines(target, this->GetConfigName(), lang, defines);
      if (!defines.empty()) {
        /* clang-format off */
      cmakefileStream
        << "\n"
        << "# Preprocessor definitions for this target.\n"
        << "set(CMAKE_TARGET_DEFINITIONS_" << lang << "\n";
        /* clang-format on */
        for (std::string const& define : defines) {
          cmakefileStream << "  " << cmOutputConverter::EscapeForCMake(define)
                          << "\n";
        }
        cmakefileStream << "  )\n";
      }

      // Target-specific include directories:
      cmakefileStream << "\n"
                      << "# The include file search paths:\n";
      cmakefileStream << "set(CMAKE_" << lang << "_TARGET_INCLUDE_PATH\n";
      std::vector<std::string> includes;

      this->GetIncludeDirectories(includes, target, lang,
                                  this->GetConfigName());
      std::string const& binaryDir = this->GetState()->GetBinaryDirectory();
      if (this->Makefile->IsOn("CMAKE_DEPENDS_IN_PROJECT_ONLY")) {
        std::string const& sourceDir = this->GetState()->GetSourceDirectory();
        cm::erase_if(includes, ::NotInProjectDir(sourceDir, binaryDir));
      }
      for (std::string const& include : includes) {
        cmakefileStream << "  \"" << this->MaybeRelativeToTopBinDir(include)
                        << "\"\n";
      }
      cmakefileStream << "  )\n";
    }

    // Store include transform rule properties.  Write the directory
    // rules first because they may be overridden by later target rules.
    std::vector<std::string> transformRules;
    if (cmValue xform =
          this->Makefile->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")) {
      cmExpandList(*xform, transformRules);
    }
    if (cmValue xform =
          target->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")) {
      cmExpandList(*xform, transformRules);
    }
    if (!transformRules.empty()) {
      cmakefileStream << "\nset(CMAKE_INCLUDE_TRANSFORMS\n";
      for (std::string const& tr : transformRules) {
        cmakefileStream << "  " << cmOutputConverter::EscapeForCMake(tr)
                        << "\n";
      }
      cmakefileStream << "  )\n";
    }
  }

  auto const& compilerLangs =
    this->GetImplicitDepends(target, cmDependencyScannerKind::Compiler);

  // list the dependency files managed by the compiler
  cmakefileStream << "\n# The set of dependency files which are needed:\n";
  cmakefileStream << "set(CMAKE_DEPENDS_DEPENDENCY_FILES\n";
  for (auto const& compilerLang : compilerLangs) {
    auto const& compilerPairs = compilerLang.second;
    if (compilerLang.first == "CUSTOM"_s) {
      for (auto const& compilerPair : compilerPairs) {
        for (auto const& src : compilerPair.second) {
          cmakefileStream << R"(  "" ")"
                          << this->MaybeRelativeToTopBinDir(compilerPair.first)
                          << R"(" "custom" ")"
                          << this->MaybeRelativeToTopBinDir(src) << "\"\n";
        }
      }
    } else {
      auto depFormat = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_", compilerLang.first, "_DEPFILE_FORMAT"));
      for (auto const& compilerPair : compilerPairs) {
        for (auto const& src : compilerPair.second) {
          cmakefileStream << "  \"" << src << "\" \""
                          << this->MaybeRelativeToTopBinDir(compilerPair.first)
                          << "\" \"" << depFormat << "\" \""
                          << this->MaybeRelativeToTopBinDir(compilerPair.first)
                          << ".d\"\n";
        }
      }
    }
  }
  cmakefileStream << "  )\n";
}